

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

char * helics::commandErrorString(int errorCode)

{
  const_iterator pvVar1;
  char *pcVar2;
  int local_4;
  
  pvVar1 = frozen::
           unordered_map<int,_std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_frozen::elsa<int>,_std::equal_to<int>_>
           ::find<int>((unordered_map<int,_std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_frozen::elsa<int>,_std::equal_to<int>_>
                        *)errorStrings,&local_4);
  if (pvVar1 == (const_iterator)(errorStrings + 200)) {
    pcVar2 = "unknown";
  }
  else {
    pcVar2 = (pvVar1->second)._M_str;
  }
  return pcVar2;
}

Assistant:

const char* commandErrorString(int errorCode)
{
    const auto* res = errorStrings.find(errorCode);
    return (res != errorStrings.end()) ? res->second.data() : static_cast<const char*>(unknownStr);
}